

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.cpp
# Opt level: O0

void __thiscall wasm::Thread::work(Thread *this,function<wasm::ThreadWorkState_()> *doWork_)

{
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  function<wasm::ThreadWorkState_()> *doWork__local;
  Thread *this_local;
  
  lock._M_device = (mutex_type *)doWork_;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->mutex);
  std::function<wasm::ThreadWorkState_()>::operator=(&this->doWork,doWork_);
  std::condition_variable::notify_one();
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void Thread::work(std::function<ThreadWorkState()> doWork_) {
  // TODO: fancy work stealing
  DEBUG_THREAD("send work to thread\n");
  {
    std::lock_guard<std::mutex> lock(mutex);
    // notify the thread that it can do some work
    doWork = doWork_;
    condition.notify_one();
    DEBUG_THREAD("work sent\n");
  }
}